

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O0

FT_Error pcf_get_metric(FT_Stream stream,FT_ULong format,PCF_Metric metric)

{
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  FT_Frame_Field *pFStack_30;
  PCF_Compressed_MetricRec compr;
  FT_Frame_Field *fields;
  FT_Error error;
  PCF_Metric metric_local;
  FT_ULong format_local;
  FT_Stream stream_local;
  
  if ((format & 0xffffff00) == 0) {
    pFStack_30 = pcf_metric_header;
    if ((format & 4) != 0) {
      pFStack_30 = pcf_metric_msb_header;
    }
    fields._4_4_ = FT_Stream_ReadFields(stream,pFStack_30,metric);
  }
  else {
    fields._4_4_ = FT_Stream_ReadFields(stream,pcf_compressed_metric_header,&local_35);
    if (fields._4_4_ == 0) {
      metric->leftSideBearing = local_35 - 0x80;
      metric->rightSideBearing = local_34 - 0x80;
      metric->characterWidth = local_33 - 0x80;
      metric->ascent = local_32 - 0x80;
      metric->descent = local_31 - 0x80;
      metric->attributes = 0;
    }
  }
  return fields._4_4_;
}

Assistant:

static FT_Error
  pcf_get_metric( FT_Stream   stream,
                  FT_ULong    format,
                  PCF_Metric  metric )
  {
    FT_Error  error = FT_Err_Ok;


    if ( PCF_FORMAT_MATCH( format, PCF_DEFAULT_FORMAT ) )
    {
      const FT_Frame_Field*  fields;


      /* parsing normal metrics */
      fields = ( PCF_BYTE_ORDER( format ) == MSBFirst )
               ? pcf_metric_msb_header
               : pcf_metric_header;

      /* the following sets `error' but doesn't return in case of failure */
      (void)FT_STREAM_READ_FIELDS( fields, metric );
    }
    else
    {
      PCF_Compressed_MetricRec  compr;


      /* parsing compressed metrics */
      if ( FT_STREAM_READ_FIELDS( pcf_compressed_metric_header, &compr ) )
        goto Exit;

      metric->leftSideBearing  = (FT_Short)( compr.leftSideBearing  - 0x80 );
      metric->rightSideBearing = (FT_Short)( compr.rightSideBearing - 0x80 );
      metric->characterWidth   = (FT_Short)( compr.characterWidth   - 0x80 );
      metric->ascent           = (FT_Short)( compr.ascent           - 0x80 );
      metric->descent          = (FT_Short)( compr.descent          - 0x80 );
      metric->attributes       = 0;
    }

    FT_TRACE5(( " width=%d,"
                " lsb=%d, rsb=%d,"
                " ascent=%d, descent=%d,"
                " attributes=%d\n",
                metric->characterWidth,
                metric->leftSideBearing,
                metric->rightSideBearing,
                metric->ascent,
                metric->descent,
                metric->attributes ));

  Exit:
    return error;
  }